

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<float,float>(Thread *this,BinopFunc<float,_float> *f)

{
  float fVar1;
  Simd<float,_(unsigned_char)__x04_> SVar2;
  byte local_49;
  undefined8 uStack_48;
  u8 i;
  SR result;
  Simd<float,_(unsigned_char)__x04_> lhs;
  Simd<float,_(unsigned_char)__x04_> rhs;
  BinopFunc<float,_float> *f_local;
  Thread *this_local;
  
  SVar2 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  lhs.v._8_8_ = SVar2.v._0_8_;
  SVar2 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  result.v[2] = (float)SVar2.v._0_8_;
  result.v[3] = SUB84(SVar2.v._0_8_,4);
  lhs.v[0] = (float)SVar2.v._8_8_;
  lhs.v[1] = SUB84(SVar2.v._8_8_,4);
  for (local_49 = 0; local_49 < 4; local_49 = local_49 + 1) {
    fVar1 = (*f)(result.v[(ulong)local_49 + 2],lhs.v[(ulong)local_49 + 2]);
    lhs.v[(ulong)local_49 - 6] = fVar1;
  }
  SVar2.v[2] = result.v[0];
  SVar2.v[3] = result.v[1];
  SVar2.v._0_8_ = uStack_48;
  Push<wabt::interp::Simd<float,(unsigned_char)4>>(this,SVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}